

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O2

apx_error_t
apx_nodeInstance_handle_provide_port_connected_to_require_port
          (apx_portInstance_t *provide_port,apx_portInstance_t *require_port)

{
  apx_nodeInstance_tag *paVar1;
  apx_portId_t aVar2;
  apx_error_t aVar3;
  
  aVar3 = 1;
  if (((require_port != (apx_portInstance_t *)0x0 && provide_port != (apx_portInstance_t *)0x0) &&
      (paVar1 = provide_port->parent, paVar1 != (apx_nodeInstance_tag *)0x0)) &&
     (require_port->parent != (apx_nodeInstance_tag *)0x0)) {
    aVar2 = apx_portInstance_port_id(provide_port);
    if (paVar1->num_provide_ports <= aVar2) {
      __assert_fail("provide_port_id < provide_node->num_provide_ports",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                    ,0x3d3,
                    "apx_error_t apx_nodeInstance_handle_provide_port_connected_to_require_port(apx_portInstance_t *, apx_portInstance_t *)"
                   );
    }
    if (paVar1->connector_table == (apx_portConnectorList_t *)0x0) {
      __assert_fail("provide_node->connector_table != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                    ,0x3d4,
                    "apx_error_t apx_nodeInstance_handle_provide_port_connected_to_require_port(apx_portInstance_t *, apx_portInstance_t *)"
                   );
    }
    aVar3 = apx_portConnectorList_insert(paVar1->connector_table + aVar2,require_port);
    if (aVar3 == 0) {
      aVar3 = route_provide_port_data_to_require_port(provide_port,require_port,true);
      return aVar3;
    }
  }
  return aVar3;
}

Assistant:

apx_error_t apx_nodeInstance_handle_provide_port_connected_to_require_port(apx_portInstance_t* provide_port, apx_portInstance_t* require_port)
{
   if ( (provide_port != NULL) && (require_port != NULL) && (provide_port->parent != NULL) && (require_port->parent != NULL))
   {
      apx_error_t retval = APX_NO_ERROR;
      apx_nodeInstance_t* provide_node = provide_port->parent;
      apx_portId_t provide_port_id = apx_portInstance_port_id(provide_port);
      assert(provide_port_id < provide_node->num_provide_ports);
      assert(provide_node->connector_table != NULL);
      retval = apx_portConnectorList_insert(&provide_node->connector_table[provide_port_id], require_port);
      if (retval == APX_NO_ERROR)
      {
         retval = route_provide_port_data_to_require_port(provide_port, require_port, true);
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}